

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleAttenNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  int iVar1;
  Property *pPVar2;
  Value *this_00;
  char *__s2;
  float fVar3;
  float floatVal;
  Value *val;
  allocator<char> local_49;
  string local_48;
  Property *local_28;
  Property *prop;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  if (node != (DDLNode *)0x0) {
    prop = (Property *)param_2;
    param_2_local = (aiScene *)node;
    node_local = (DDLNode *)this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"curve",&local_49);
    pPVar2 = ODDLParser::DDLNode::findPropertyByName(node,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if ((pPVar2 != (Property *)0x0) && (pPVar2->m_value != (Value *)0x0)) {
      local_28 = pPVar2;
      this_00 = ODDLParser::DDLNode::getValue((DDLNode *)param_2_local);
      fVar3 = ODDLParser::Value::getFloat(this_00);
      __s2 = ODDLParser::Value::getString(local_28->m_value);
      iVar1 = strncmp("scale",__s2,5);
      if (iVar1 == 0) {
        this->m_currentLight->mAttenuationQuadratic = fVar3;
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleAttenNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if ( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "curve" );
    if ( nullptr != prop ) {
        if ( nullptr != prop->m_value ) {
            Value *val( node->getValue() );
            const float floatVal( val->getFloat() );
            if ( 0 == strncmp( "scale", prop->m_value->getString(), strlen( "scale" ) ) ) {
                m_currentLight->mAttenuationQuadratic = floatVal;
            }
        }
    }
}